

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::bracketModifiers(string *unit_string)

{
  size_type sVar1;
  char cVar2;
  pointer pcVar3;
  void *pvVar4;
  const_iterator cVar5;
  size_type sVar6;
  size_t sVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  size_type sVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tstring;
  long local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar9 = false;
  local_60 = 0;
  do {
    if (1 < unit_string->_M_string_length) {
      pcVar3 = (unit_string->_M_dataplus)._M_p;
      pvVar4 = memchr(pcVar3 + 1,(int)**(char **)((long)&Esegs_abi_cxx11_ + local_60),
                      unit_string->_M_string_length - 1);
      uVar10 = (long)pvVar4 - (long)pcVar3;
      if (uVar10 != 0xffffffffffffffff && pvVar4 != (void *)0x0) {
        do {
          uVar8 = 0xffffffffffffffff;
          sVar7 = unit_string->_M_string_length - uVar10;
          if (uVar10 <= unit_string->_M_string_length && sVar7 != 0) {
            pcVar3 = (unit_string->_M_dataplus)._M_p;
            pvVar4 = memchr(pcVar3 + uVar10,
                            (int)*(char *)(*(long *)((long)&Esegs_abi_cxx11_ + local_60) + 1),sVar7)
            ;
            uVar8 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)pcVar3;
          }
          sVar1 = uVar10 + 1;
          sVar11 = uVar8 - uVar10;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar1,sVar11 - 1);
          cVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)modifiers_abi_cxx11_,(key_type *)&local_50);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            if (uVar8 + 1 < unit_string->_M_string_length) {
              do {
                cVar2 = (unit_string->_M_dataplus)._M_p[uVar8 + 1];
                if (cVar2 != ' ') {
                  if (((uVar8 != 0xfffffffffffffffe) && (cVar2 != '*')) && (cVar2 != '/')) {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,uVar8 + 1,1,'*');
                  }
                  break;
                }
                uVar8 = uVar8 + 1;
              } while (unit_string->_M_string_length - 1 != uVar8);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,sVar1,sVar11,
                    *(char **)((long)cVar5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                     ._M_cur + 0x28),
                    *(size_type *)
                     ((long)cVar5.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x30));
            (unit_string->_M_dataplus)._M_p[uVar10] = '_';
            bVar9 = true;
          }
          uVar10 = 0xffffffffffffffff;
          sVar7 = unit_string->_M_string_length - sVar1;
          if (sVar1 <= unit_string->_M_string_length && sVar7 != 0) {
            pcVar3 = (unit_string->_M_dataplus)._M_p;
            pvVar4 = memchr(pcVar3 + sVar1,(int)**(char **)((long)&Esegs_abi_cxx11_ + local_60),
                            sVar7);
            uVar10 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)pcVar3;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        } while (uVar10 != 0xffffffffffffffff);
      }
    }
    local_60 = local_60 + 0x20;
    if (local_60 == 0x80) {
      if (1 < unit_string->_M_string_length) {
        pcVar3 = (unit_string->_M_dataplus)._M_p;
        pvVar4 = memchr(pcVar3 + 1,0x2d,unit_string->_M_string_length - 1);
        uVar10 = (long)pvVar4 - (long)pcVar3;
        if (uVar10 != 0xffffffffffffffff && pvVar4 != (void *)0x0) {
          sVar1 = uVar10 + 1;
          sVar6 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,"-[({_",sVar1,5);
          sVar11 = sVar6;
          if (sVar6 != 0xffffffffffffffff) {
            sVar11 = ~uVar10 + sVar6;
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 sVar1,sVar11);
          cVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)modifiers_abi_cxx11_,(key_type *)&local_50);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,sVar1,~uVar10 + sVar6,
                    *(char **)((long)cVar5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                     ._M_cur + 0x28),
                    *(size_type *)
                     ((long)cVar5.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x30));
            (unit_string->_M_dataplus)._M_p[uVar10] = '_';
            bVar9 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      return bVar9;
    }
  } while( true );
}

Assistant:

bool bracketModifiers(std::string& unit_string)
{
    bool modified{false};
    for (const auto& seg : Esegs) {
        auto ploc = unit_string.find_first_of(seg[0], 1);
        while (ploc != std::string::npos) {
            auto cloc = unit_string.find_first_of(seg[1], ploc);
            auto tstring = unit_string.substr(ploc + 1, cloc - ploc - 1);
            auto modloc = modifiers.find(tstring);
            if (modloc != modifiers.end()) {
                auto nextloc = unit_string.find_first_not_of(' ', cloc + 1);
                if (nextloc != std::string::npos &&
                    unit_string[nextloc] != '/' &&
                    unit_string[nextloc] != '*') {
                    unit_string.insert(nextloc, 1, '*');
                }

                unit_string.replace(ploc + 1, cloc - ploc, modloc->second);
                unit_string[ploc] = '_';
                modified = true;
            }
            ploc = unit_string.find_first_of(seg[0], ploc + 1);
        }
    }
    // if (!modified) {
    auto ploc = unit_string.find_first_of('-', 1);
    if (ploc != std::string::npos) {
        auto cloc = unit_string.find_first_of("-[({_", ploc + 1);
        auto tstring = (cloc != std::string::npos) ?
            unit_string.substr(ploc + 1, cloc - ploc - 1) :
            unit_string.substr(ploc + 1);
        auto modloc = modifiers.find(tstring);
        if (modloc != modifiers.end()) {
            unit_string.replace(ploc + 1, cloc - ploc - 1, modloc->second);
            unit_string[ploc] = '_';
            modified = true;
        }
    }
    //}
    return modified;
}